

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

double mg_set_timer(mg_connection *c,double timestamp)

{
  double dVar1;
  double result;
  double timestamp_local;
  mg_connection *c_local;
  
  dVar1 = c->ev_timer_time;
  c->ev_timer_time = timestamp;
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_set_timer");
    cs_log_printf("%p %p %d -> %lu",c,c->priv_2,(ulong)((uint)c->flags & 4),
                  (long)timestamp |
                  (long)(timestamp - 9.223372036854776e+18) & (long)timestamp >> 0x3f);
  }
  if (((c->flags & 4) != 0) && (c->priv_2 != (void *)0x0)) {
    *(double *)((long)c->priv_2 + 0x88) = timestamp;
  }
  return dVar1;
}

Assistant:

double mg_set_timer(struct mg_connection *c, double timestamp) {
    double result = c->ev_timer_time;
    c->ev_timer_time = timestamp;
    /*
   * If this connection is resolving, it's not in the list of active
   * connections, so not processed yet. It has a DNS resolver connection
   * linked to it. Set up a timer for the DNS connection.
   */
    DBG(("%p %p %d -> %lu", c, c->priv_2, c->flags & MG_F_RESOLVING,
            (unsigned long) timestamp));
    if ((c->flags & MG_F_RESOLVING) && c->priv_2 != NULL) {
        ((struct mg_connection *) c->priv_2)->ev_timer_time = timestamp;
    }
    return result;
}